

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void reset_channel_effects(IT_CHANNEL *channel)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 5) = 0;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)(in_RDI + 7) = 0;
  *(undefined1 *)(in_RDI + 0xd) = 0;
  *(uchar **)(in_RDI + 0x28) = "";
  memset((void *)(in_RDI + 0x30),0,3);
  *(undefined1 *)(in_RDI + 0x38) = 0;
  if (*(char *)(in_RDI + 0x39) != '\0') {
    *(undefined1 *)(in_RDI + 0x39) = 0;
    *(undefined4 *)(in_RDI + 0x3c) = 0;
  }
  *(byte *)(in_RDI + 0x41) = *(byte *)(in_RDI + 0x41) & 0x7f;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  if (*(char *)(in_RDI + 0x56) == '\0') {
    *(undefined1 *)(in_RDI + 0x57) = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 0x57) = *(undefined1 *)(in_RDI + 0x56);
    *(undefined1 *)(in_RDI + 0x55) = *(undefined1 *)(in_RDI + 0x54);
  }
  *(undefined1 *)(in_RDI + 0x56) = 0;
  *(undefined1 *)(in_RDI + 0x54) = 0;
  *(undefined1 *)(in_RDI + 0x58) = 0;
  if (*(long *)(in_RDI + 0x88) != 0) {
    *(undefined1 *)(*(long *)(in_RDI + 0x88) + 0x53) = 0;
    *(undefined1 *)(*(long *)(in_RDI + 0x88) + 0x56) = 0;
    *(undefined1 *)(*(long *)(in_RDI + 0x88) + 0x57) = 0;
    *(undefined1 *)(*(long *)(in_RDI + 0x88) + 0x5a) = 0;
  }
  return;
}

Assistant:

static void reset_channel_effects(IT_CHANNEL *channel)
{
	channel->volslide = 0;
	channel->xm_volslide = 0;
	channel->panslide = 0;
	channel->channelvolslide = 0;
	channel->arpeggio_table = (const unsigned char *) &arpeggio_mod;
	memset(channel->arpeggio_offsets, 0, sizeof(channel->arpeggio_offsets));
	channel->retrig = 0;
	if (channel->xm_retrig) {
		channel->xm_retrig = 0;
		channel->retrig_tick = 0;
	}
	channel->tremor_time &= 127;
	channel->portamento = 0;
	channel->toneporta = 0;
	if (channel->ptm_toneslide) {
		channel->ptm_last_toneslide = channel->ptm_toneslide;
		channel->last_toneslide_tick = channel->toneslide_tick;
	} else
		channel->ptm_last_toneslide = 0;
	channel->ptm_toneslide = 0;
	channel->toneslide_tick = 0;
	channel->okt_toneslide = 0;
	if (channel->playing) {
		channel->playing->vibrato_n = 0;
		channel->playing->tremolo_speed = 0;
		channel->playing->tremolo_depth = 0;
		channel->playing->panbrello_speed = 0;
	}
}